

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O3

uint8 * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteRawMaybeAliased
          (EpsCopyOutputStream *this,void *data,int size,uint8 *ptr)

{
  uint8 *puVar1;
  size_t __n;
  
  if (this->aliasing_enabled_ == true) {
    puVar1 = WriteAliasedRaw(this,data,size,ptr);
    return puVar1;
  }
  __n = (size_t)size;
  if ((long)__n <= (long)this->end_ - (long)ptr) {
    memcpy(ptr,data,__n);
    return ptr + __n;
  }
  puVar1 = WriteRawFallback(this,data,size,ptr);
  return puVar1;
}

Assistant:

uint8* WriteRawMaybeAliased(const void* data, int size, uint8* ptr) {
    if (aliasing_enabled_) {
      return WriteAliasedRaw(data, size, ptr);
    } else {
      return WriteRaw(data, size, ptr);
    }
  }